

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.h
# Opt level: O1

bool __thiscall
FlatZinc::SymbolTable<std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_>::
get(SymbolTable<std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_> *this,
   string *key,vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_> *val)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_>_>_>
                  *)this,key);
  p_Var2 = &(this->m)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2) {
    std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>::operator=
              (val,(vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_> *)
                   (cVar1._M_node + 2));
  }
  return (_Rb_tree_header *)cVar1._M_node != p_Var2;
}

Assistant:

bool get(const std::string& key, Val& val) const {
		typename std::map<std::string, Val>::const_iterator i = m.find(key);
		if (i == m.end()) {
			return false;
		}
		val = i->second;
		return true;
	}